

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

bool __thiscall dg::vr::VRLocation::isJustLoopJoin(VRLocation *this)

{
  bool bVar1;
  reference ppVVar2;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *in_RDI;
  VREdge *pred;
  const_iterator __end2;
  const_iterator __begin2;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *__range2;
  VREdge *in_stack_ffffffffffffffd0;
  __normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
  local_20;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *local_18;
  bool local_1;
  
  bVar1 = isJoin((VRLocation *)0x1bff87);
  if (bVar1) {
    local_18 = in_RDI + 10;
    local_20._M_current =
         (VREdge **)std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>::begin(in_RDI);
    std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>::end(in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
                               *)in_stack_ffffffffffffffd0,
                              (__normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
                               *)in_RDI), bVar1) {
      ppVVar2 = __gnu_cxx::
                __normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
                ::operator*(&local_20);
      in_stack_ffffffffffffffd0 = *ppVVar2;
      if ((in_stack_ffffffffffffffd0->type != TREE) && (in_stack_ffffffffffffffd0->type != BACK)) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
      ::operator++(&local_20);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VRLocation::isJustLoopJoin() const {
    // allows TREE and BACK
    if (!isJoin())
        return false;
    for (VREdge *pred : predecessors) {
        if (pred->type != EdgeType::TREE && pred->type != EdgeType::BACK)
            return false;
    }
    return true;
}